

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar-memory-write-test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  size_t __n;
  size_t sVar3;
  int error_2;
  int error_1;
  int error;
  size_t size;
  FILE *fp;
  char *str2;
  char *str1;
  mtar_t tar;
  char **argv_local;
  int argc_local;
  
  tar.memory_capacity = (size_t)argv;
  if (argc < 2) {
    printf("error: no argument\n");
    argv_local._4_4_ = 1;
  }
  else {
    __stream = fopen(argv[1],"rb");
    if (__stream == (FILE *)0x0) {
      printf("error: unable to open\n");
      argv_local._4_4_ = 6;
    }
    else {
      __n = fread(main::buf,1,4000,__stream);
      if (__n == 0) {
        printf("error: unable to read\n");
        fclose(__stream);
        argv_local._4_4_ = 7;
      }
      else {
        fclose(__stream);
        uVar1 = mtar_open_memory((mtar_t *)&str1,(void *)0x0,0);
        if (uVar1 == 0) {
          sVar3 = strlen("Hello world");
          mtar_write_file_header((mtar_t *)&str1,"test1.txt",sVar3);
          sVar3 = strlen("Hello world");
          mtar_write_data((mtar_t *)&str1,"Hello world",sVar3);
          sVar3 = strlen("Goodbye world");
          mtar_write_file_header((mtar_t *)&str1,"test2.txt",sVar3);
          sVar3 = strlen("Goodbye world");
          mtar_write_data((mtar_t *)&str1,"Goodbye world",sVar3);
          uVar1 = mtar_finalize((mtar_t *)&str1);
          if (uVar1 == 0) {
            if (__n == tar.memory_pos) {
              iVar2 = memcmp(main::buf,(void *)tar.last_header,__n);
              if (iVar2 == 0) {
                uVar1 = mtar_close((mtar_t *)&str1);
                if (uVar1 == 0) {
                  puts("success");
                  argv_local._4_4_ = 0;
                }
                else {
                  printf("error: %d\n",(ulong)uVar1);
                  argv_local._4_4_ = 4;
                }
              }
              else {
                printf("data differs\n");
                argv_local._4_4_ = 6;
              }
            }
            else {
              printf("size differs\n");
              argv_local._4_4_ = 5;
            }
          }
          else {
            printf("error: %d\n",(ulong)uVar1);
            argv_local._4_4_ = 3;
          }
        }
        else {
          printf("error: %d\n",(ulong)uVar1);
          argv_local._4_4_ = 2;
        }
      }
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    mtar_t tar;
    const char *str1 = "Hello world";
    const char *str2 = "Goodbye world";

    if (argc < 2)
    {
        printf("error: no argument\n");
        return 1;
    }

    FILE *fp = fopen(argv[1], "rb");
    if (!fp)
    {
        printf("error: unable to open\n");
        return 6;
    }

    static char buf[4000];
    size_t size = fread(buf, 1, 4000, fp);
    if (!size)
    {
        printf("error: unable to read\n");
        fclose(fp);
        return 7;
    }
    fclose(fp);

    if (int error = mtar_open_memory(&tar, NULL, 0))
    {
        printf("error: %d\n", error);
        return 2;
    }

    mtar_write_file_header(&tar, "test1.txt", strlen(str1));
    mtar_write_data(&tar, str1, strlen(str1));
    mtar_write_file_header(&tar, "test2.txt", strlen(str2));
    mtar_write_data(&tar, str2, strlen(str2));

    if (int error = mtar_finalize(&tar))
    {
        printf("error: %d\n", error);
        return 3;
    }

    if (size != tar.memory_size)
    {
        printf("size differs\n");
        return 5;
    }

    if (memcmp(buf, tar.memory, size) != 0)
    {
        printf("data differs\n");
        return 6;
    }

    if (int error = mtar_close(&tar))
    {
        printf("error: %d\n", error);
        return 4;
    }

    puts("success");
    return 0;
}